

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS AttachStackObjectToPreviousObject
                    (ParseStack *Stack,int32_t StackIndex,size_t *pErrorAtPos)

{
  ParseStack *pPVar1;
  ParseStack *prevStackItem;
  ParseStack *currentStackItem;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  int32_t StackIndex_local;
  ParseStack *Stack_local;
  
  if (StackIndex < 1) {
    currentStackItem._4_4_ = JL_STATUS_SUCCESS;
  }
  else {
    pPVar1 = Stack + (StackIndex + -1);
    if (pPVar1->Type == JL_DATA_TYPE_LIST) {
      currentStackItem._4_4_ = JlAttachObjectToListObject(pPVar1->Object,Stack[StackIndex].Object);
    }
    else if (pPVar1->Type == JL_DATA_TYPE_DICTIONARY) {
      currentStackItem._4_4_ =
           JlAttachObjectToDictionaryObject
                     (pPVar1->Object,pPVar1->CurrentKeyName,Stack[StackIndex].Object);
      if ((currentStackItem._4_4_ != JL_STATUS_SUCCESS) && (pErrorAtPos != (size_t *)0x0)) {
        *pErrorAtPos = pPVar1->CurrentKeyStringIndex;
      }
      WjTestLib_Free(pPVar1->CurrentKeyName);
      pPVar1->CurrentKeyName = (char *)0x0;
    }
    else {
      currentStackItem._4_4_ = JL_STATUS_SUCCESS;
    }
  }
  return currentStackItem._4_4_;
}

Assistant:

static
JL_STATUS
    AttachStackObjectToPreviousObject
    (
        ParseStack*     Stack,
        int32_t         StackIndex,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if( StackIndex > 0 )
    {
        ParseStack* currentStackItem = &Stack[StackIndex];
        ParseStack* prevStackItem = &Stack[StackIndex-1];

        if( JL_DATA_TYPE_LIST == prevStackItem->Type )
        {
            jlStatus = JlAttachObjectToListObject( prevStackItem->Object, currentStackItem->Object );
        }
        else if( JL_DATA_TYPE_DICTIONARY == prevStackItem->Type )
        {
            jlStatus = JlAttachObjectToDictionaryObject( prevStackItem->Object, prevStackItem->CurrentKeyName, currentStackItem->Object );
            if(     JL_STATUS_SUCCESS != jlStatus
                &&  NULL != pErrorAtPos )
            {
                *pErrorAtPos = prevStackItem->CurrentKeyStringIndex;
            }
            JlFree( prevStackItem->CurrentKeyName );
            prevStackItem->CurrentKeyName = NULL;
        }
        else
        {
            // nothing to attach it to. This occurs when the root object in the json is not a dictionary or list
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else
    {
        // nothing to attach it to. This occurs when the root object in the json is not a dictionary or list
        jlStatus = JL_STATUS_SUCCESS;
    }

    return jlStatus;
}